

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * mxx::get_processor_name_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_11e;
  undefined1 local_11d;
  int local_11c;
  char local_118 [4];
  int p_len;
  char p_name [257];
  string *str;
  
  MPI_Get_processor_name(local_118,&local_11c);
  local_118[local_11c] = '\0';
  local_11d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_118,&local_11e);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e);
  return in_RDI;
}

Assistant:

std::string get_processor_name() {
    char p_name[MPI_MAX_PROCESSOR_NAME+1];
    int p_len;
    MPI_Get_processor_name(p_name, &p_len);
    p_name[p_len] = '\0'; // make string NULL-terminated (if not yet so)
    std::string str(p_name);
    return str;
}